

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

Vec_Int_t * Hsh_WrdManHashArray(Vec_Wrd_t *vDataW,int nSize)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int local_44;
  int nEntries;
  int i;
  Vec_Int_t *vRes;
  Vec_Int_t *vData;
  Vec_Int_t Data;
  Hsh_IntMan_t *p;
  int nSize_local;
  Vec_Wrd_t *vDataW_local;
  
  iVar1 = Vec_WrdCap(vDataW);
  vData._0_4_ = iVar1 << 1;
  iVar1 = Vec_WrdSize(vDataW);
  vData._4_4_ = iVar1 << 1;
  Data._0_8_ = Vec_WrdArray(vDataW);
  p_00 = Vec_IntAlloc(100);
  iVar1 = Vec_IntSize((Vec_Int_t *)&vData);
  iVar1 = iVar1 / (nSize << 1);
  iVar2 = Vec_IntSize((Vec_Int_t *)&vData);
  if (iVar2 % (nSize << 1) == 0) {
    Data.pArray = &Hsh_IntManStart((Vec_Int_t *)&vData,nSize << 1,iVar1)->nSize;
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      iVar2 = Hsh_IntManAdd((Hsh_IntMan_t *)Data.pArray,local_44);
      Vec_IntPush(p_00,iVar2);
    }
    Hsh_IntManStop((Hsh_IntMan_t *)Data.pArray);
    return p_00;
  }
  __assert_fail("Vec_IntSize(vData) % (2*nSize) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecHsh.h"
                ,0xd2,"Vec_Int_t *Hsh_WrdManHashArray(Vec_Wrd_t *, int)");
}

Assistant:

static inline Vec_Int_t * Hsh_WrdManHashArray( Vec_Wrd_t * vDataW, int nSize )
{
    Hsh_IntMan_t * p;
    Vec_Int_t Data = { 2*Vec_WrdCap(vDataW), 2*Vec_WrdSize(vDataW), (int *)Vec_WrdArray(vDataW) };
    Vec_Int_t * vData = &Data;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    int i, nEntries = Vec_IntSize(vData) / (2*nSize);
    assert( Vec_IntSize(vData) % (2*nSize) == 0 );
    p = Hsh_IntManStart( vData, (2*nSize), nEntries );
    for ( i = 0; i < nEntries; i++ )
        Vec_IntPush( vRes, Hsh_IntManAdd(p, i) );
    Hsh_IntManStop( p );
    return vRes;
}